

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemViewPrivate::scrollerStateChanged(QAbstractItemViewPrivate *this)

{
  bool bVar1;
  State SVar2;
  QScroller *pQVar3;
  QItemSelectionModel *pQVar4;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  bool wasAutoScroll;
  QScroller *scroller;
  QAbstractItemView *q;
  undefined4 in_stack_ffffffffffffff38;
  SelectionFlag in_stack_ffffffffffffff3c;
  QScroller *in_stack_ffffffffffffff40;
  QAbstractItemViewPrivate *target;
  undefined8 local_70;
  quintptr local_68;
  QAbstractItemModel *local_60;
  undefined1 local_58 [24];
  undefined4 local_40;
  undefined4 local_3c;
  undefined8 local_38;
  quintptr local_30;
  QAbstractItemModel *local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  target = in_RDI;
  q_func(in_RDI);
  pQVar3 = QScroller::scroller((QObject *)target);
  if (pQVar3 != (QScroller *)0x0) {
    SVar2 = QScroller::state(in_stack_ffffffffffffff40);
    if (SVar2 == Pressed) {
      pQVar4 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff40);
      if (pQVar4 != (QItemSelectionModel *)0x0) {
        QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff40);
        QItemSelectionModel::selection();
        QItemSelection::operator=
                  ((QItemSelection *)in_stack_ffffffffffffff40,
                   (QItemSelection *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        QItemSelection::~QItemSelection((QItemSelection *)0x7ff8c7);
        QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff40);
        QItemSelectionModel::currentIndex();
        (in_RDI->oldCurrent).r = (undefined4)local_38;
        (in_RDI->oldCurrent).c = local_38._4_4_;
        (in_RDI->oldCurrent).i = local_30;
        (in_RDI->oldCurrent).m.ptr = local_28;
      }
    }
    else {
      if ((SVar2 == Dragging) &&
         (pQVar4 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff40)
         , pQVar4 != (QItemSelectionModel *)0x0)) {
        in_stack_ffffffffffffff40 =
             (QScroller *)
             QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff40);
        QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                  ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff3c);
        (**(code **)(*(long *)in_stack_ffffffffffffff40 + 0x70))
                  (in_stack_ffffffffffffff40,&in_RDI->oldSelection,local_3c);
        bVar1 = in_RDI->autoScroll;
        in_RDI->autoScroll = false;
        pQVar4 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff40);
        QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                  ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff3c);
        (**(code **)(*(long *)pQVar4 + 0x60))(pQVar4,&in_RDI->oldCurrent,local_40);
        in_RDI->autoScroll = (bool)(bVar1 & 1);
      }
      memset(local_58,0,0x18);
      QItemSelection::QItemSelection((QItemSelection *)0x7ffa07);
      QItemSelection::operator=
                ((QItemSelection *)in_stack_ffffffffffffff40,
                 (QItemSelection *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QItemSelection::~QItemSelection((QItemSelection *)0x7ffa27);
      QModelIndex::QModelIndex((QModelIndex *)0x7ffa31);
      (in_RDI->oldCurrent).r = (undefined4)local_70;
      (in_RDI->oldCurrent).c = local_70._4_4_;
      (in_RDI->oldCurrent).i = local_68;
      (in_RDI->oldCurrent).m.ptr = local_60;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::scrollerStateChanged()
{
    Q_Q(QAbstractItemView);

    if (QScroller *scroller = QScroller::scroller(viewport)) {
        switch (scroller->state()) {
        case QScroller::Pressed:
            // store the current selection in case we start scrolling
            if (q->selectionModel()) {
                oldSelection = q->selectionModel()->selection();
                oldCurrent = q->selectionModel()->currentIndex();
            }
            break;

        case QScroller::Dragging:
            // restore the old selection if we really start scrolling
            if (q->selectionModel()) {
                q->selectionModel()->select(oldSelection, QItemSelectionModel::ClearAndSelect);
                // block autoScroll logic while we are already handling scrolling
                const bool wasAutoScroll = autoScroll;
                autoScroll = false;
                q->selectionModel()->setCurrentIndex(oldCurrent, QItemSelectionModel::NoUpdate);
                autoScroll = wasAutoScroll;
            }
            Q_FALLTHROUGH();

        default:
            oldSelection = QItemSelection();
            oldCurrent = QModelIndex();
            break;
        }
    }
}